

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O2

void __thiscall tinyjson::json_node::~json_node(json_node *this)

{
  node_type nVar1;
  pointer ppjVar2;
  json_node *pjVar3;
  array *paVar4;
  linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
  *this_00;
  pointer ppjVar5;
  array *paVar6;
  ulong uStack_30;
  
  nVar1 = this->type;
  if (nVar1 == object_type) {
    paVar4 = (this->storage).array_val;
    paVar6 = paVar4;
    while (paVar6 = (array *)(paVar6->
                             super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                             )._M_impl.super__Vector_impl_data._M_start, paVar6 != paVar4) {
      pjVar3 = (json_node *)
               paVar6[2].
               super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pjVar3 != (json_node *)0x0) {
        ~json_node(pjVar3);
      }
      operator_delete(pjVar3,0x10);
    }
    this_00 = (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
               *)(this->storage).str_val;
    if (this_00 !=
        (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
         *)0x0) {
      linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
      ::~linked_hash_map(this_00);
    }
    uStack_30 = 0x50;
  }
  else if (nVar1 == array_type) {
    ppjVar2 = (((this->storage).array_val)->
              super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppjVar5 = (((this->storage).array_val)->
                   super__Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppjVar5 != ppjVar2;
        ppjVar5 = ppjVar5 + 1) {
      pjVar3 = *ppjVar5;
      if (pjVar3 != (json_node *)0x0) {
        ~json_node(pjVar3);
      }
      operator_delete(pjVar3,0x10);
    }
    this_00 = (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
               *)(this->storage).str_val;
    if (this_00 !=
        (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
         *)0x0) {
      std::_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::
      ~_Vector_base((_Vector_base<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                    this_00);
    }
    uStack_30 = 0x18;
  }
  else {
    if (nVar1 != string_type) {
      return;
    }
    this_00 = (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
               *)(this->storage).str_val;
    if (this_00 !=
        (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
         *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    uStack_30 = 0x20;
  }
  operator_delete(this_00,uStack_30);
  return;
}

Assistant:

~json_node() {
      clear();
    }